

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_util.h
# Opt level: O0

int compute_sampled_width(int width,int x_sampling,int start_x)

{
  undefined4 local_14;
  int start_x_local;
  int x_sampling_local;
  int width_local;
  undefined4 local_4;
  
  local_4 = width;
  if (1 < x_sampling) {
    if (width == 1) {
      local_14 = 1;
    }
    else {
      local_14 = width / x_sampling;
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

static inline int
compute_sampled_width (int width, int x_sampling, int start_x)
{
    /*
     * we require that the start_x % x_sampling == 0 and for tiled images (and for deep),
     * x_sampling must be 1, so this can simplify the math compared to the y case
     * where when we are reading scanline images, we always are reading the entire
     * width. If this changes, can look like the above call for the lines, but
     * for now can be simpler math
     */
    if (x_sampling <= 1) return width;

    return (width == 1) ? 1 : (width / x_sampling);
}